

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall
Scene::load_buffers_and_draw_cmd
          (Scene *this,shared_ptr<myvk::Queue> *graphics_queue,
          vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *meshes)

{
  _Atomic_word *p_Var1;
  pointer pDVar2;
  pointer pMVar3;
  long lVar4;
  pointer __src;
  pointer pVVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  source_loc loc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  ulong uVar13;
  size_t sVar14;
  pointer pMVar15;
  logger *plVar16;
  undefined4 extraout_var;
  size_t __n;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *size;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *__range1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *size_00;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  initializer_list<VkBufferCopy> __l;
  initializer_list<VkBufferCopy> __l_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> remap;
  vector<Vertex,_std::allocator<Vertex>_> vertices;
  vector<Vertex,_std::allocator<Vertex>_> naive_vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  shared_ptr<myvk::Buffer> vertex_staging_buffer;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::Buffer> index_staging_buffer;
  shared_ptr<myvk::CommandPool> command_pool;
  uint local_160;
  allocator_type local_159;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> local_158;
  float local_13c;
  vector<Vertex,_std::allocator<Vertex>_> local_138;
  vector<Vertex,_std::allocator<Vertex>_> local_118;
  Ptr<BufferBase> local_100;
  Ptr<BufferBase> local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  undefined1 local_c8 [40];
  element_type *local_a0;
  float local_98;
  float local_94;
  undefined1 local_90 [32];
  Fence local_70;
  Ptr<CommandPool> local_40;
  Ptr<Device> *device;
  
  pDVar2 = (this->m_draw_commands).
           super__Vector_base<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_draw_commands).super__Vector_base<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar2) {
    (this->m_draw_commands).super__Vector_base<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>.
    _M_impl.super__Vector_impl_data._M_finish = pDVar2;
  }
  local_160 = 0;
  local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pMVar15 = (meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar3 = (meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar15 != pMVar3) {
    local_160 = 0;
    do {
      local_160 = local_160 +
                  (int)((ulong)((long)(pMVar15->m_vertices).
                                      super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(pMVar15->m_vertices).
                                     super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2) * -0x33333333;
      pMVar15 = pMVar15 + 1;
    } while (pMVar15 != pMVar3);
  }
  local_90._16_8_ = graphics_queue;
  std::vector<Vertex,_std::allocator<Vertex>_>::resize(&local_118,(ulong)local_160);
  local_70.m_fence = (VkFence)&this->m_draw_commands;
  std::vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>::resize
            ((vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_> *)local_70.m_fence,
             ((long)(meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  pMVar15 = (meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_90._24_8_ = meshes;
  local_70.m_device_ptr.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if ((meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>)._M_impl.
      super__Vector_impl_data._M_finish != pMVar15) {
    uVar20 = 0;
    uVar19 = 1;
    uVar17 = 0;
    do {
      lVar4 = *(long *)local_70.m_fence;
      lVar21 = uVar20 * 0x10;
      *(uint32_t *)(lVar4 + lVar21) = pMVar15[uVar20].m_texture_id;
      fVar23 = pMVar15[uVar20].m_albedo.field_0.x;
      fVar24 = 0.0;
      if (0.0 <= fVar23) {
        fVar24 = fVar23;
      }
      fVar23 = pMVar15[uVar20].m_albedo.field_1.y;
      fVar25 = 0.0;
      if (0.0 <= fVar23) {
        fVar25 = fVar23;
      }
      fVar23 = pMVar15[uVar20].m_albedo.field_2.z;
      fVar26 = 0.0;
      if (0.0 <= fVar23) {
        fVar26 = fVar23;
      }
      fVar23 = 1.0;
      if (fVar24 <= 1.0) {
        fVar23 = fVar24;
      }
      local_13c = 1.0;
      if (fVar25 <= 1.0) {
        local_13c = fVar25;
      }
      local_94 = 1.0;
      if (fVar26 <= 1.0) {
        local_94 = fVar26;
      }
      local_13c = local_13c * 255.0;
      local_94 = local_94 * 255.0;
      local_98 = roundf(fVar23 * 255.0);
      local_13c = roundf(local_13c);
      fVar23 = roundf(local_94);
      *(uint *)(lVar4 + 4 + lVar21) =
           (int)local_98 & 0xffU | ((int)local_13c & 0xffU) << 8 | ((int)fVar23 & 0xffU) << 0x10;
      *(uint *)(lVar4 + 0xc + lVar21) = uVar17;
      __src = pMVar15[uVar20].m_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl
              .super__Vector_impl_data._M_start;
      pVVar5 = pMVar15[uVar20].m_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      *(int *)(lVar4 + 8 + lVar21) = (int)((ulong)((long)pVVar5 - (long)__src) >> 2) * -0x33333333;
      __n = (long)pVVar5 - (long)__src;
      if (__n != 0) {
        memmove(local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                super__Vector_impl_data._M_start + uVar17,__src,__n);
      }
      uVar17 = uVar17 + (int)((ulong)((long)pMVar15[uVar20].m_vertices.
                                            super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar15[uVar20].m_vertices.
                                           super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 2) *
                        -0x33333333;
      uVar20 = (ulong)uVar19;
      pMVar15 = *(pointer *)local_90._24_8_;
      uVar13 = ((long)*(pointer *)(local_90._24_8_ + 8) - (long)pMVar15 >> 3) * -0x3333333333333333;
      uVar19 = uVar19 + 1;
    } while (uVar20 <= uVar13 && uVar13 - uVar20 != 0);
  }
  uVar9 = local_90._24_8_;
  local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_start = (Vertex *)0x0;
  local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Vertex *)0x0;
  local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_e0,(ulong)local_160,(allocator_type *)&local_158);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_158,(ulong)local_160,
             (allocator_type *)local_c8);
  sVar14 = meshopt_generateVertexRemap
                     ((uint *)local_158.
                              super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                              _M_impl.super__Vector_impl_data._M_start,(uint *)0x0,(ulong)local_160,
                      local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)local_160,0x14);
  uVar20 = sVar14 & 0xffffffff;
  std::vector<Vertex,_std::allocator<Vertex>_>::resize(&local_138,uVar20);
  meshopt_remapIndexBuffer
            (local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,(uint *)0x0,(ulong)local_160,
             (uint *)local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  meshopt_remapVertexBuffer
            (local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start,(ulong)local_160,0x14,
             (uint *)local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage !=
      local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::__shrink_to_fit_aux<std::vector<Vertex,_std::allocator<Vertex>_>,_true>::_S_do_it
              (&local_118);
  }
  pMVar15 = *(pointer *)uVar9;
  if (*(pointer *)(uVar9 + 8) != pMVar15) {
    uVar17 = 0;
    uVar13 = 0;
    uVar18 = 1;
    do {
      uVar19 = (int)((long)pMVar15[uVar13].m_vertices.
                           super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)pMVar15[uVar13].m_vertices.
                           super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2) * -0x33333333;
      meshopt_optimizeVertexCache
                (local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar17,
                 local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar17,(ulong)uVar19,uVar20);
      meshopt_optimizeOverdraw
                (local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar17,
                 local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar17,(ulong)uVar19,
                 (float *)local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                          super__Vector_impl_data._M_start,uVar20,0x14,1.05);
      uVar17 = uVar17 + uVar19;
      pMVar15 = *(pointer *)local_90._24_8_;
      uVar13 = ((long)*(pointer *)(local_90._24_8_ + 8) - (long)pMVar15 >> 3) * -0x3333333333333333;
      bVar22 = uVar18 <= uVar13;
      lVar4 = uVar13 - uVar18;
      uVar13 = uVar18;
      uVar18 = (ulong)((int)uVar18 + 1);
    } while (bVar22 && lVar4 != 0);
  }
  meshopt_optimizeVertexFetch
            (local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,(ulong)local_160,
             local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start,uVar20,0x14);
  _Var8._M_pi = local_70.m_device_ptr.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_90._0_8_ =
       ((long)local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
              super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  plVar16 = spdlog::default_logger_raw();
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._0_8_ = "Mesh optimized ({}/{} vertices)";
  local_c8._8_8_ = (element_type *)0x1f;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  spdlog::logger::log_<fmt::v7::basic_string_view<char>,unsigned_long,unsigned_int&>
            (plVar16,loc,info,(basic_string_view<char> *)local_c8,(unsigned_long *)local_90,
             &local_160);
  iVar12 = (*(((__shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2> *)local_90._16_8_)->_M_ptr->
             super_DeviceObjectBase).super_Base._vptr_Base[2])();
  device = (Ptr<Device> *)CONCAT44(extraout_var,iVar12);
  iVar7 = (int)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
  iVar12 = (int)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  size = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ulong)((int)local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start & 0xfffffffc);
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create
            ((Buffer *)local_c8,device,(VkDeviceSize)size,0,0x82,VMA_MEMORY_USAGE_AUTO,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&local_158);
  uVar11 = local_c8._8_8_;
  uVar9 = local_c8._0_8_;
  local_c8._0_8_ = (_func_int **)0x0;
  uVar10 = local_c8._0_8_;
  local_c8._8_8_ = (element_type *)0x0;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_pi[3]._vptr__Sp_counted_base;
  local_c8._0_4_ = (undefined4)uVar9;
  local_c8._4_4_ = SUB84(uVar9,4);
  _Var8._M_pi[2]._M_use_count = local_c8._0_4_;
  _Var8._M_pi[2]._M_weak_count = local_c8._4_4_;
  _Var8._M_pi[3]._vptr__Sp_counted_base = (_func_int **)uVar11;
  local_c8._0_8_ = uVar10;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&local_158);
  size_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(iVar12 - iVar7 & 0xfffffffc);
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create
            ((Buffer *)local_c8,device,(VkDeviceSize)size_00,0,0x42,VMA_MEMORY_USAGE_AUTO,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&local_158);
  uVar11 = local_c8._8_8_;
  uVar9 = local_c8._0_8_;
  local_c8._0_8_ = (_func_int **)0x0;
  uVar10 = local_c8._0_8_;
  local_c8._8_8_ = (element_type *)0x0;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_pi[4]._vptr__Sp_counted_base;
  local_c8._0_4_ = (undefined4)uVar9;
  local_c8._4_4_ = SUB84(uVar9,4);
  _Var8._M_pi[3]._M_use_count = local_c8._0_4_;
  _Var8._M_pi[3]._M_weak_count = local_c8._4_4_;
  _Var8._M_pi[4]._vptr__Sp_counted_base = (_func_int **)uVar11;
  local_c8._0_8_ = uVar10;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&local_158);
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::
  CreateStaging<__gnu_cxx::__normal_iterator<Vertex*,std::vector<Vertex,std::allocator<Vertex>>>>
            ((Buffer *)local_90,device,
             (__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>)
             local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>)
             local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&local_158);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&local_158);
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::
  CreateStaging<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((Buffer *)
             &local_70.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
              _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             device,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     )local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&local_158);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&local_158);
  myvk::Fence::Create((Fence *)(local_90 + 0x20),device,0);
  myvk::CommandPool::Create((CommandPool *)&local_40,(Ptr<Queue> *)local_90._16_8_,0);
  myvk::CommandBuffer::Create
            ((CommandBuffer *)(local_c8 + 0x20),&local_40,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  myvk::CommandBuffer::Begin((CommandBuffer *)local_c8._32_8_,1);
  uVar9 = local_c8._32_8_;
  local_f0.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_90._0_8_;
  local_f0.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_;
  if ((element_type *)local_90._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((enable_shared_from_this<myvk::Base> *)(local_90._8_8_ + 8))->_M_weak_this).
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((enable_shared_from_this<myvk::Base> *)(local_90._8_8_ + 8))->_M_weak_this).
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((enable_shared_from_this<myvk::Base> *)(local_90._8_8_ + 8))->_M_weak_this).
               super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((enable_shared_from_this<myvk::Base> *)(local_90._8_8_ + 8))->_M_weak_this).
                    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)&_Var8._M_pi[2]._M_use_count;
  local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_pi[3]._vptr__Sp_counted_base;
  if (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_c8._0_8_ = (_func_int **)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_c8;
  local_c8._16_8_ = size;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector(&local_158,__l,&local_159);
  myvk::CommandBuffer::CmdCopy((CommandBuffer *)uVar9,&local_f0,&local_100,&local_158);
  if (local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)
      local_f0.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  uVar9 = local_c8._32_8_;
  local_f0.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_70.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
       _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_f0.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_70.m_device_ptr.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_70.m_device_ptr.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               ((long)&(local_70.m_device_ptr.
                        super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super_Base + 8);
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               ((long)&(local_70.m_device_ptr.
                        super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super_Base + 8);
      *p_Var1 = *p_Var1 + 1;
    }
  }
  local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)&_Var8._M_pi[3]._M_use_count;
  local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_pi[4]._vptr__Sp_counted_base;
  if (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_c8._0_8_ = (_func_int **)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_c8;
  local_c8._16_8_ = size_00;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector(&local_158,__l_00,&local_159);
  myvk::CommandBuffer::CmdCopy((CommandBuffer *)uVar9,&local_f0,&local_100,&local_158);
  if (local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((VmaAllocation)
      local_f0.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (VmaAllocation)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  myvk::CommandBuffer::End((CommandBuffer *)local_c8._32_8_);
  myvk::CommandBuffer::Submit((CommandBuffer *)local_c8._32_8_,(Ptr<Fence> *)(local_90 + 0x20));
  myvk::Fence::Wait((Fence *)local_70.super_DeviceObjectBase.super_Base._vptr_Base,
                    0xffffffffffffffff);
  plVar16 = spdlog::default_logger_raw();
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spdlog::logger::log(plVar16,0.0);
  if (local_a0 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0);
  }
  if ((element_type *)
      local_40.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)
      local_70.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_70.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (local_70.m_device_ptr.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_70.m_device_ptr.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if ((element_type *)local_90._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  if (local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
      _M_start != (Vertex *)0x0) {
    operator_delete(local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Scene::load_buffers_and_draw_cmd(const std::shared_ptr<myvk::Queue> &graphics_queue,
                                      const std::vector<Mesh> &meshes) {
	m_draw_commands.clear();

	// count vertices, set draw commands and vertex buffers
	uint32_t index_count = 0;
	std::vector<Vertex> naive_vertices;
	{
		for (const Mesh &mesh : meshes)
			index_count += mesh.m_vertices.size();
		naive_vertices.resize(index_count);
		m_draw_commands.resize(meshes.size());
		for (uint32_t i = 0, c = 0; i < meshes.size(); ++i) {
			const Mesh &mesh = meshes[i];
			m_draw_commands[i].m_push_constant.m_texture_id = mesh.m_texture_id;
			m_draw_commands[i].m_push_constant.m_albedo = glm::packUnorm4x8(glm::vec4(mesh.m_albedo, 0.0f));
			m_draw_commands[i].m_first_index = c;
			m_draw_commands[i].m_index_count = mesh.m_vertices.size();

			std::copy(mesh.m_vertices.begin(), mesh.m_vertices.end(), naive_vertices.begin() + c);
			c += mesh.m_vertices.size();
		}
	}

	// build index buffer and optimize meshes
	std::vector<Vertex> vertices;
	std::vector<uint32_t> indices(index_count);
	{
		std::vector<unsigned int> remap(index_count);
		uint32_t vertex_count = meshopt_generateVertexRemap(remap.data(), nullptr, index_count, naive_vertices.data(),
		                                                    index_count, sizeof(Vertex));
		vertices.resize(vertex_count);
		meshopt_remapIndexBuffer(indices.data(), nullptr, index_count, remap.data());
		meshopt_remapVertexBuffer(vertices.data(), naive_vertices.data(), index_count, sizeof(Vertex), remap.data());
		naive_vertices.clear();
		naive_vertices.shrink_to_fit();

		for (uint32_t i = 0, c = 0; i < meshes.size(); ++i) {
			uint32_t mesh_vert_cnt = meshes[i].m_vertices.size();
			meshopt_optimizeVertexCache(indices.data() + c, indices.data() + c, mesh_vert_cnt, vertex_count);
			meshopt_optimizeOverdraw(indices.data() + c, indices.data() + c, mesh_vert_cnt, &vertices[0].m_position.x,
			                         vertex_count, sizeof(Vertex), 1.05f);
			c += mesh_vert_cnt;
		}
		meshopt_optimizeVertexFetch(vertices.data(), indices.data(), index_count, vertices.data(), vertex_count,
		                            sizeof(Vertex));
	}
	spdlog::info("Mesh optimized ({}/{} vertices)", vertices.size(), index_count);

	const std::shared_ptr<myvk::Device> &device = graphics_queue->GetDevicePtr();
	uint32_t vertex_buffer_size = vertices.size() * sizeof(Vertex),
	         index_buffer_size = indices.size() * sizeof(uint32_t);
	m_vertex_buffer = myvk::Buffer::Create(device, vertex_buffer_size, 0,
	                                       VK_BUFFER_USAGE_VERTEX_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	m_index_buffer = myvk::Buffer::Create(device, index_buffer_size, 0,
	                                      VK_BUFFER_USAGE_INDEX_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT);

	std::shared_ptr<myvk::Buffer> vertex_staging_buffer =
	    myvk::Buffer::CreateStaging(device, vertices.begin(), vertices.end());
	std::shared_ptr<myvk::Buffer> index_staging_buffer =
	    myvk::Buffer::CreateStaging(device, indices.begin(), indices.end());

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);
	std::shared_ptr<myvk::CommandPool> command_pool = myvk::CommandPool::Create(graphics_queue);
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdCopy(vertex_staging_buffer, m_vertex_buffer, {{0, 0, vertex_buffer_size}});
	command_buffer->CmdCopy(index_staging_buffer, m_index_buffer, {{0, 0, index_buffer_size}});
	command_buffer->End();
	command_buffer->Submit(fence);

	fence->Wait();

	spdlog::info("Vertex and Index buffers generated");
}